

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int cmp_init_el(void *p1,void *p2)

{
  long lVar1;
  mir_size_t mVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  lVar1 = *(long *)((long)p1 + 0x18);
  if ((lVar1 == 0) || ((int)*(uint *)(lVar1 + 4) < 0)) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)(*(uint *)(lVar1 + 4) >> 3);
  }
  lVar3 = *(long *)((long)p2 + 0x18);
  if ((lVar3 == 0) || ((int)*(uint *)(lVar3 + 4) < 0)) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)(*(uint *)(lVar3 + 4) >> 3);
  }
  uVar4 = uVar4 + *(long *)((long)p1 + 0x10);
  uVar6 = uVar6 + *(long *)((long)p2 + 0x10);
  uVar5 = 0xffffffff;
  if ((uVar6 <= uVar4) && (uVar5 = 1, uVar4 <= uVar6)) {
    if (lVar1 != 0) {
      if (lVar3 != 0) {
        if (*(int *)(lVar1 + 4) < *(int *)(lVar3 + 4)) {
          return -1;
        }
        if (*(int *)(lVar3 + 4) < *(int *)(lVar1 + 4)) {
          return 1;
        }
      }
      mVar2 = type_size(*p1,*(type **)(lVar1 + 0x40));
      if (mVar2 == 0) {
        return -1;
      }
      lVar3 = *(long *)((long)p2 + 0x18);
    }
    if ((lVar3 == 0) || (mVar2 = type_size(*p2,*(type **)(lVar3 + 0x40)), mVar2 != 0)) {
      uVar5 = 0xffffffff;
      if (*(ulong *)((long)p2 + 8) <= *(ulong *)((long)p1 + 8)) {
        uVar5 = (uint)(*(ulong *)((long)p2 + 8) < *(ulong *)((long)p1 + 8));
      }
    }
  }
  return uVar5;
}

Assistant:

static int cmp_init_el (const void *p1, const void *p2) {
  const init_el_t *el1 = p1, *el2 = p2;
  int bit_offset1 = el1->member_decl == NULL || el1->member_decl->bit_offset < 0
                      ? 0
                      : el1->member_decl->bit_offset;
  int bit_offset2 = el2->member_decl == NULL || el2->member_decl->bit_offset < 0
                      ? 0
                      : el2->member_decl->bit_offset;

  if (el1->offset + bit_offset1 / MIR_CHAR_BIT < el2->offset + bit_offset2 / MIR_CHAR_BIT)
    return -1;
  else if (el1->offset + bit_offset1 / MIR_CHAR_BIT > el2->offset + bit_offset2 / MIR_CHAR_BIT)
    return 1;
  else if (el1->member_decl != NULL && el2->member_decl != NULL
           && el1->member_decl->bit_offset < el2->member_decl->bit_offset)
    return -1;
  else if (el1->member_decl != NULL && el2->member_decl != NULL
           && el1->member_decl->bit_offset > el2->member_decl->bit_offset)
    return 1;
  else if (el1->member_decl != NULL
           && type_size (el1->c2m_ctx, el1->member_decl->decl_spec.type) == 0)
    return -1;
  else if (el2->member_decl != NULL
           && type_size (el2->c2m_ctx, el2->member_decl->decl_spec.type) == 0)
    return 1;
  else if (el1->num < el2->num)
    return -1;
  else if (el1->num > el2->num)
    return 1;
  else
    return 0;
}